

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O3

int Wlc_StdinProcessSmt(Abc_Frame_t *pAbc,char *pCmd)

{
  int iVar1;
  Vec_Str_t *__ptr;
  Wlc_Ntk_t *pNtk;
  Abc_Frame_t *pAVar2;
  char *pcVar3;
  
  __ptr = Wlc_StdinCollectProblem("(check-sat)");
  pcVar3 = __ptr->pArray;
  pNtk = Wlc_ReadSmtBuffer("top",pcVar3,pcVar3 + __ptr->nSize,0,0);
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  free(__ptr);
  Wlc_SetNtk(pAbc,pNtk);
  pAVar2 = pAbc;
  iVar1 = Cmd_CommandExecute(pAbc,pCmd);
  if (iVar1 != 0) {
    Abc_Print((int)pAVar2,"Something did not work out with the command \"%s\".\n",pCmd);
    return 0;
  }
  iVar1 = Abc_FrameReadProbStatus(pAbc);
  if (iVar1 == -1) {
    pcVar3 = "undecided";
  }
  else {
    iVar1 = Abc_FrameReadProbStatus(pAbc);
    if (iVar1 == 1) {
      pcVar3 = "unsat";
    }
    else {
      iVar1 = Abc_FrameReadProbStatus(pAbc);
      if (iVar1 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                      ,0xd4,"int Wlc_StdinProcessSmt(Abc_Frame_t *, char *)");
      }
      pcVar3 = "sat";
    }
  }
  puts(pcVar3);
  fflush(_stdout);
}

Assistant:

int Wlc_StdinProcessSmt( Abc_Frame_t * pAbc, char * pCmd )
{
    // collect stdin until (check-sat)
    Vec_Str_t * vInput = Wlc_StdinCollectProblem( "(check-sat)" );
    // parse input
    Wlc_Ntk_t * pNtk = Wlc_ReadSmtBuffer( "top", Vec_StrArray(vInput), Vec_StrArray(vInput) + Vec_StrSize(vInput), 0, 0 );
    Vec_StrFree( vInput );
    // install current network
    Wlc_SetNtk( pAbc, pNtk );
    // execute command
    if ( Cmd_CommandExecute(pAbc, pCmd) )
    {
        Abc_Print( 1, "Something did not work out with the command \"%s\".\n", pCmd );
        return 0;
    }
    // solver finished
    if ( Abc_FrameReadProbStatus(pAbc) == -1 )
        printf( "undecided\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 1 )
        printf( "unsat\n" );
    else if ( Abc_FrameReadProbStatus(pAbc) == 0 )
        printf( "sat\n" );
    else assert( 0 );
    fflush( stdout );
    // wait for stdin for give directions
    while ( (vInput = Wlc_StdinCollectQuery()) != NULL )
    {
        char * pName = strtok( Vec_StrArray(vInput), " \n\t\r()" );
        // check directive 
        if ( strcmp(pName, "get-value") )
        {
            Abc_Print( 1, "ABC is expecting \"get-value\" in a follow-up input of the satisfiable problem.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // check status
        if ( Abc_FrameReadProbStatus(pAbc) != 0 )
        {
            Abc_Print( 1, "ABC received a follow-up input for a problem that is not known to be satisfiable.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // get the variable number
        pName = strtok( NULL, "() \n\t\r" );
        // get the counter-example
        if ( Abc_FrameReadCex(pAbc) == NULL )
        {
            Abc_Print( 1, "ABC does not have a counter-example available to process a \"get-value\" request.\n" );
            Vec_StrFree( vInput );
            return 0;
        }
        // report value of this variable
        Wlc_NtkReport( (Wlc_Ntk_t *)pAbc->pAbcWlc, (Abc_Cex_t *)Abc_FrameReadCex(pAbc), pName, 16 );
        Vec_StrFree( vInput );
        fflush( stdout );
    }
    return 1;
}